

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
MXNetNode::attr_ai(vector<int,_std::allocator<int>_> *__return_storage_ptr__,MXNetNode *this,
                  char *key)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  bool bVar4;
  int nconsumed;
  int i;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,key,(allocator<char> *)&nconsumed)
  ;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->attrs)._M_t,(key_type *)&i);
  std::__cxx11::string::~string((string *)&i);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((_Rb_tree_header *)cVar2._M_node != &(this->attrs)._M_t._M_impl.super__Rb_tree_header) {
    i = 0;
    nconsumed = 0;
    iVar1 = __isoc99_sscanf(*(undefined8 *)(cVar2._M_node + 2),"%*[(,]%d%n");
    bVar4 = true;
    if (iVar1 != 1) {
      iVar1 = strncmp(*(char **)(cVar2._M_node + 2),"(None",5);
      if (iVar1 == 0) {
        i = -0xe9;
        nconsumed = 5;
      }
      else {
        bVar4 = false;
      }
    }
    lVar3 = 0;
    while (bVar4) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&i);
      i = 0;
      lVar3 = (long)(int)lVar3 + (long)nconsumed;
      iVar1 = __isoc99_sscanf(*(long *)(cVar2._M_node + 2) + lVar3,"%*[(,]%d%n",&i,&nconsumed);
      bVar4 = true;
      if (iVar1 != 1) {
        iVar1 = strncmp((char *)(lVar3 + *(long *)(cVar2._M_node + 2)),", None",6);
        bVar4 = false;
        if (iVar1 == 0) {
          i = -0xe9;
          nconsumed = 6;
          bVar4 = true;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> MXNetNode::attr_ai(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<int>();

    // (1,2,3)
    std::vector<int> list;

    int i = 0;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
    if (nscan != 1)
    {
        // (None
        if (strncmp(it->second.c_str() + c, "(None", 5) == 0)
        {
            i = -233;
            nconsumed = 5;
            nscan = 1;
        }
    }
    while (nscan == 1)
    {
        list.push_back(i);
//         fprintf(stderr, "%d\n", i);

        i = 0;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
        if (nscan != 1)
        {
            // , None
            if (strncmp(it->second.c_str() + c, ", None", 6) == 0)
            {
                i = -233;
                nconsumed = 6;
                nscan = 1;
            }
        }
    }

    return list;
}